

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::WebSocket_*> * __thiscall
asl::Array<asl::WebSocket_*>::insert(Array<asl::WebSocket_*> *this,int k,WebSocket **x)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  WebSocket **ppWVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  
  ppWVar4 = this->_a;
  iVar1 = *(int *)(ppWVar4 + -2);
  iVar2 = *(int *)((long)ppWVar4 + -0xc);
  iVar6 = k;
  if (k < 0) {
    iVar6 = iVar1;
  }
  if (iVar1 < iVar2) {
    ppWVar4 = ppWVar4 + -2;
LAB_0012a1ee:
    if (iVar1 - iVar6 != 0 && iVar6 <= iVar1) {
      memmove(this->_a + (long)iVar6 + 1,this->_a + iVar6,(long)(iVar1 - iVar6) << 3);
    }
    this->_a[iVar6] = *x;
    *(int *)ppWVar4 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    uVar3 = *(undefined4 *)(this->_a + -1);
    iVar7 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar7 = iVar2 * 2 + 2;
    }
    ppWVar4 = (WebSocket **)realloc(this->_a + -2,(long)iVar7 * 8 + 0x10);
    if (ppWVar4 != (WebSocket **)0x0) {
      this->_a = ppWVar4 + 2;
      *(int *)((long)ppWVar4 + 4) = iVar7;
      *(undefined4 *)(ppWVar4 + 1) = uVar3;
      goto LAB_0012a1ee;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = dup2;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}